

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

void __thiscall Basis::rebuild(Basis *this)

{
  size_type sVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar3;
  long in_RDI;
  size_t i;
  HighsTimerClock *in_stack_00000090;
  HFactor *in_stack_00000098;
  size_type in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  
  *(undefined4 *)(in_RDI + 0x8a0) = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x755799);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(value_type_conflict2 *)0x7557c9);
  HFactor::build(in_stack_00000098,in_stack_00000090);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8f8));
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x910));
    if (sVar1 + sVar2 <= local_18) break;
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x970);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x928),local_18);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
    *pvVar3 = (value_type)local_18;
    local_18 = local_18 + 1;
  }
  *(undefined1 *)(in_RDI + 0xb60) = 0;
  return;
}

Assistant:

void Basis::rebuild() {
  //  report();

  updatessinceinvert = 0;
  constraintindexinbasisfactor.clear();

  constraintindexinbasisfactor.assign(Atran.num_row + Atran.num_col, -1);
  assert((HighsInt)(non_active_constraint_index.size() +
                    active_constraint_index.size()) == Atran.num_row);

  basisfactor.build();

  for (size_t i = 0;
       i < active_constraint_index.size() + non_active_constraint_index.size();
       i++) {
    constraintindexinbasisfactor[baseindex[i]] = i;
  }
  reinversion_hint = false;
}